

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccipher.t.c
# Opt level: O2

void test_cipher_caesar_parse_key(void)

{
  byte bVar1;
  char text4 [3];
  char text3 [3];
  char text2 [3];
  uint key;
  char text [13];
  
  builtin_strncpy(text + 8,"key!",5);
  builtin_strncpy(text,"Invalid ",8);
  text2[2] = '\0';
  text2[0] = '1';
  text2[1] = '2';
  text3[2] = '\0';
  text3[0] = '2';
  text3[1] = '6';
  text4[2] = '\0';
  text4[0] = '2';
  text4[1] = '7';
  key = 0;
  bVar1 = caesar_parse_key(text,&key);
  UnityAssertEqualNumber(0,(ulong)bVar1,(char *)0x0,0x65,UNITY_DISPLAY_STYLE_INT);
  bVar1 = caesar_parse_key(text2,&key);
  UnityAssertEqualNumber(1,(ulong)bVar1,(char *)0x0,0x68,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(0xc,(ulong)key,(char *)0x0,0x69,UNITY_DISPLAY_STYLE_UINT);
  bVar1 = caesar_parse_key(text3,&key);
  UnityAssertEqualNumber(1,(ulong)bVar1,(char *)0x0,0x6c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(0x1a,(ulong)key,(char *)0x0,0x6d,UNITY_DISPLAY_STYLE_UINT);
  bVar1 = caesar_parse_key(text4,&key);
  UnityAssertEqualNumber(0,(ulong)bVar1,(char *)0x0,0x6f,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

void test_cipher_caesar_parse_key(void)
{
	char text[] = "Invalid key!";
	char text2[] = "12";
	char text3[] = "26";
	char text4[] = "27";

	unsigned int key = 0;
	bool success;

	TEST_ASSERT_EQUAL_INT(false, caesar_parse_key(text, &key));

	success = caesar_parse_key(text2, &key);
	TEST_ASSERT_EQUAL_INT(true, success);
	TEST_ASSERT_EQUAL_UINT(12, key);

	success = caesar_parse_key(text3, &key);
	TEST_ASSERT_EQUAL_INT(true, success);
	TEST_ASSERT_EQUAL_UINT(26, key);

	TEST_ASSERT_EQUAL_INT(false, caesar_parse_key(text4, &key));
}